

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O2

int lws_h2_goaway(lws *wsi,uint32_t err,char *reason)

{
  lws_h2_netconn *plVar1;
  lws_h2_protocol_send *pps;
  char *pcVar2;
  int iVar3;
  
  plVar1 = (wsi->h2).h2n;
  iVar3 = 0;
  if (plVar1->type != '\n') {
    pps = lws_h2_new_pps(LWS_H2_PPS_GOAWAY);
    if (pps == (lws_h2_protocol_send *)0x0) {
      iVar3 = 1;
    }
    else {
      pcVar2 = lws_wsi_tag(wsi);
      iVar3 = 0;
      _lws_log(8,"%s: %s: ERR 0x%x, \'%s\'\n","lws_h2_goaway",pcVar2,err,reason);
      (pps->u).ga.err = err;
      (pps->u).ga.highest_sid = plVar1->highest_sid;
      lws_strncpy((char *)&pps->u,reason,0x20);
      lws_pps_schedule(wsi,pps);
      plVar1->type = '\n';
    }
  }
  return iVar3;
}

Assistant:

int
lws_h2_goaway(struct lws *wsi, uint32_t err, const char *reason)
{
	struct lws_h2_netconn *h2n = wsi->h2.h2n;
	struct lws_h2_protocol_send *pps;

	if (h2n->type == LWS_H2_FRAME_TYPE_COUNT)
		return 0;

	pps = lws_h2_new_pps(LWS_H2_PPS_GOAWAY);
	if (!pps)
		return 1;

	lwsl_info("%s: %s: ERR 0x%x, '%s'\n", __func__, lws_wsi_tag(wsi), (int)err, reason);

	pps->u.ga.err = err;
	pps->u.ga.highest_sid = h2n->highest_sid;
	lws_strncpy(pps->u.ga.str, reason, sizeof(pps->u.ga.str));
	lws_pps_schedule(wsi, pps);

	h2n->type = LWS_H2_FRAME_TYPE_COUNT; /* ie, IGNORE */

	return 0;
}